

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# core.c
# Opt level: O0

int uv_cwd(char *buffer,size_t *size)

{
  char *pcVar1;
  int *piVar2;
  size_t sVar3;
  size_t *size_local;
  char *buffer_local;
  
  if ((buffer == (char *)0x0) || (size == (size_t *)0x0)) {
    buffer_local._4_4_ = -0x16;
  }
  else {
    pcVar1 = getcwd(buffer,*size);
    if (pcVar1 == (char *)0x0) {
      piVar2 = __errno_location();
      buffer_local._4_4_ = -*piVar2;
    }
    else {
      sVar3 = strlen(buffer);
      *size = sVar3;
      if ((1 < *size) && (buffer[*size - 1] == '/')) {
        buffer[*size - 1] = '\0';
        *size = *size - 1;
      }
      buffer_local._4_4_ = 0;
    }
  }
  return buffer_local._4_4_;
}

Assistant:

int uv_cwd(char* buffer, size_t* size) {
  if (buffer == NULL || size == NULL)
    return UV_EINVAL;

  if (getcwd(buffer, *size) == NULL)
    return UV__ERR(errno);

  *size = strlen(buffer);
  if (*size > 1 && buffer[*size - 1] == '/') {
    buffer[*size-1] = '\0';
    (*size)--;
  }

  return 0;
}